

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  short sVar1;
  ushort uVar2;
  ulong uVar3;
  ushort uVar4;
  ulong uVar5;
  
  if (factor != 1) {
    if (factor == 0) {
      this->used_bigits_ = 0;
      this->exponent_ = 0;
    }
    else {
      uVar2 = this->used_bigits_;
      if (uVar2 != 0) {
        uVar3 = 0;
        uVar4 = 0;
        if (0 < (short)uVar2) {
          uVar4 = uVar2;
        }
        uVar5 = 0;
        for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          uVar5 = (ulong)this->bigits_buffer_[uVar3] * (ulong)factor + uVar5;
          this->bigits_buffer_[uVar3] = (uint)uVar5 & 0xfffffff;
          uVar5 = uVar5 >> 0x1c;
        }
        for (; uVar5 != 0; uVar5 = uVar5 >> 0x1c) {
          EnsureCapacity((short)uVar2 + 1);
          sVar1 = this->used_bigits_;
          this->bigits_buffer_[sVar1] = (uint)uVar5 & 0xfffffff;
          uVar2 = sVar1 + 1;
          this->used_bigits_ = uVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(const uint32_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  DOUBLE_CONVERSION_ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const DoubleChunk product = static_cast<DoubleChunk>(factor) * RawBigit(i) + carry;
    RawBigit(i) = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}